

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmq.c
# Opt level: O2

void nni_lmq_flush(nni_lmq *lmq)

{
  nni_msg *m;
  
  while (lmq->lmq_len != 0) {
    m = lmq->lmq_msgs[lmq->lmq_get];
    lmq->lmq_get = lmq->lmq_get + 1 & lmq->lmq_mask;
    lmq->lmq_len = lmq->lmq_len - 1;
    nni_msg_free(m);
  }
  return;
}

Assistant:

void
nni_lmq_flush(nni_lmq *lmq)
{
	while (lmq->lmq_len > 0) {
		nng_msg *msg = lmq->lmq_msgs[lmq->lmq_get++];
		lmq->lmq_get &= lmq->lmq_mask;
		lmq->lmq_len--;
		nni_msg_free(msg);
	}
}